

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O2

ssize_t __thiscall BOCC_CTA::read(BOCC_CTA *this,int __fd,void *__buf,size_t __nbytes)

{
  Transaction *this_00;
  DataItem *pDVar1;
  char cVar2;
  mapped_type *ppTVar3;
  int __fd_00;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  ulong uVar4;
  pthread_mutex_t *__mutex;
  Transaction *cur;
  int tid_local;
  
  __fd_00 = (int)__buf;
  tid_local = __fd;
  std::__shared_mutex_pthread::lock_shared(&(this->scheduler_lock)._M_impl);
  std::mutex::lock(&(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[__fd_00]->lock);
  ppTVar3 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->transactions,&tid_local);
  this_00 = *ppTVar3;
  __mutex = (pthread_mutex_t *)&this_00->t_status_mtx;
  cur = this_00;
  std::mutex::lock((mutex *)&__mutex->__data);
  cVar2 = Transaction::getStatus(this_00);
  pDVar1 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
           super__Vector_impl_data._M_start[__fd_00];
  if (cVar2 == 'a') {
    std::
    _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
    ::erase(&(pDVar1->read_list)._M_t,&cur);
    __mutex = (pthread_mutex_t *)&cur->t_status_mtx;
    uVar4 = 0xfffffffffffffffe;
  }
  else {
    *(int *)__nbytes = pDVar1->value;
    Transaction::read(this_00,__fd_00,(void *)CONCAT44(extraout_var,extraout_EDX),__nbytes);
    uVar4 = 0;
  }
  pthread_mutex_unlock(__mutex);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
              super__Vector_impl_data._M_start[__fd_00]->lock);
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
  return uVar4 & 0xffffffff;
}

Assistant:

int BOCC_CTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    //curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}